

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwriter_buffer.c
# Opt level: O0

void aom_wb_write_bit(aom_write_bit_buffer *wb,int bit)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  int q;
  int p;
  int off;
  int bit_local;
  aom_write_bit_buffer *wb_local;
  
  uVar1 = wb->bit_offset;
  iVar2 = (int)uVar1 / 8;
  iVar3 = 7 - (int)uVar1 % 8;
  bVar4 = (byte)iVar3;
  if (iVar3 == 7) {
    wb->bit_buffer[iVar2] = (uint8_t)(bit << (bVar4 & 0x1f));
  }
  else {
    wb->bit_buffer[iVar2] = wb->bit_buffer[iVar2] & ((byte)(1 << (bVar4 & 0x1f)) ^ 0xff);
    wb->bit_buffer[iVar2] = wb->bit_buffer[iVar2] | (byte)(bit << (bVar4 & 0x1f));
  }
  wb->bit_offset = uVar1 + 1;
  return;
}

Assistant:

void aom_wb_write_bit(struct aom_write_bit_buffer *wb, int bit) {
  const int off = (int)wb->bit_offset;
  const int p = off / CHAR_BIT;
  const int q = CHAR_BIT - 1 - off % CHAR_BIT;
  if (q == CHAR_BIT - 1) {
    // Zero next char and write bit
    wb->bit_buffer[p] = bit << q;
  } else {
    wb->bit_buffer[p] &= ~(1 << q);
    wb->bit_buffer[p] |= bit << q;
  }
  wb->bit_offset = off + 1;
}